

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

void ipc_listener_doclose(ipc_listener *l)

{
  char *__name;
  nni_aio *aio_00;
  char *path;
  nni_aio *aio;
  ipc_listener *l_local;
  
  l->closed = true;
  while( true ) {
    aio_00 = (nni_aio *)nni_list_first(&l->acceptq);
    if (aio_00 == (nni_aio *)0x0) break;
    nni_aio_list_remove(aio_00);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  nni_posix_pfd_close(&l->pfd);
  if (((l->started & 1U) != 0) && (__name = l->path, __name != (char *)0x0)) {
    l->path = (char *)0x0;
    unlink(__name);
    nni_strfree(__name);
  }
  return;
}

Assistant:

static void
ipc_listener_doclose(ipc_listener *l)
{
	nni_aio *aio;
	char    *path;

	l->closed = true;
	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_posix_pfd_close(&l->pfd);
	if (l->started && ((path = l->path) != NULL)) {
		l->path = NULL;
		(void) unlink(path);
		nni_strfree(path);
	}
}